

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containersNative.cpp
# Opt level: O2

PackageInfo * chatra::emb::containers::packageInfo(void)

{
  _Alloc_hider _Var1;
  long lVar2;
  PackageInfo *in_RDI;
  initializer_list<chatra::Script> __l;
  initializer_list<chatra::NativeCallHandlerInfo> __l_00;
  NativeCallHandlerInfo local_540 [4];
  NativeCallHandlerInfo local_3a0;
  NativeCallHandlerInfo local_338;
  NativeCallHandlerInfo local_2d0;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  undefined1 local_68 [8];
  vector<chatra::Script,_std::allocator<chatra::Script>_> scripts;
  vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> handlers;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator_type local_2b;
  allocator local_2a;
  allocator_type local_29;
  
  std::__cxx11::string::string
            ((string *)&local_268,"containers",
             (allocator *)
             &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::string
            ((string *)&local_248,
             "\n/*\n * Programming language \'Chatra\' reference implementation\n *\n * Copyright(C) 2019-2020 Chatra Project Team\n *\n * Licensed under the Apache License, Version 2.0 (the \"License\");\n * you may not use this file except in compliance with the License.\n * You may obtain a copy of the License at\n *\n *   http://www.apache.org/licenses/LICENSE-2.0\n *\n * Unless required by applicable law or agreed to in writing, software\n * distributed under the License is distributed on an \"AS IS\" BASIS,\n * WITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\n * See the License for the specific language governing permissions and\n * limitations under the License.\n *\n * author: Satoshi Hosokawa (chatra.hosokawa@gmail.com)\n */\n\nclass ByteArray extends VariableLengthSequence\n\tdef _init_instance() as native\n\tdef _init_instance(value) as native\n\n\tdef init()\n\t\tsuper()\n\t\t_init_instance()\n\n\tdef init(value: String)\n\t\tsuper()\n\t\t_init_instance(value)\n\n\tdef init(value: ByteArray)\n\t\tsuper()\n\t\t_init_instance(value)\n\n\tdef size() as native\n\n\tdef _native_resize(a0) as native\n\n\tdef resize(newSize: Int)\n\t\t_native_resize(newSize)\n\t\treturn self\n\n\tdef has(value)\n\t\tt0 = size()\n\t\tt1 = 0\n\t\twhile t1 < t0\n\t\t\tif _native_at(t1++) == value\n\t\t\t\treturn true\n\t\treturn false\n\n\tdef _native_add(a0) as native\n\n\tdef add(a0...;)\n\t\tt0 = a0.size()\n\t\tt1 = 0\n\t\twhile t1 < t0\n\t\t\t_native_add(a0[t1++])\n\t\treturn self\n\n\tdef add(a0)\n\t\t_native_add(a0)\n\t\treturn self\n\n\tdef append(a0)\n\t\tif a0 == null\n\t\t\treturn self\n\t\tfor t0 in a0\n\t\t\tadd(t0)\n\t\treturn self\n\n\tdef _native_insert(a0, a1) as native\n\n\tdef insert(position: Int, a0...;)\n\t\tt0 = a0.size()\n\t\tt1 = 0\n\t\twhile t1 < t0\n\t\t\t_native_insert(position + t1, a0[t1])\n\t\t\tt1++\n\t\treturn self\n\n\tdef insert(position: Int, a0)\n\t\t_native_insert(position, a0)\n\t\treturn self\n\n\tdef _native_at(a0) as native\n\n\tdef (position: Int)\n\t\treturn _native_at(position)\n\n\tdef _native_at(a0, a1) as native\n\n\tdef (position: Int).set(r)\n\t\treturn _native_at(position, r)\n\n\tdef remove(position: Int) as native\n\n\tdef remove(a0: IndexSet)\n\t\tt0 = Array()\n\t\tif a0.fi..." /* TRUNCATED STRING LITERAL */
             ,&local_2a);
  Script::Script((Script *)local_540,&local_268,&local_248);
  __l._M_len = 1;
  __l._M_array = (iterator)local_540;
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_68,__l,&local_29);
  Script::~Script((Script *)local_540);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::string((string *)&local_228,"ByteArray",&local_2a);
  std::__cxx11::string::string((string *)&local_208,"_init_instance",(allocator *)&local_29);
  NativeCallHandlerInfo::NativeCallHandlerInfo
            (local_540,byteArray_initInstance,&local_228,&local_208);
  std::__cxx11::string::string
            ((string *)&local_1e8,"ByteArray",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  std::__cxx11::string::string
            ((string *)&local_1c8,"size",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 2));
  NativeCallHandlerInfo::NativeCallHandlerInfo(local_540 + 1,byteArray_size,&local_1e8,&local_1c8);
  std::__cxx11::string::string
            ((string *)&local_1a8,"ByteArray",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::__cxx11::string::string
            ((string *)&local_188,"_native_resize",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  NativeCallHandlerInfo::NativeCallHandlerInfo(local_540 + 2,byteArray_resize,&local_1a8,&local_188)
  ;
  std::__cxx11::string::string
            ((string *)&local_168,"ByteArray",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  std::__cxx11::string::string
            ((string *)&local_148,"_native_add",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  NativeCallHandlerInfo::NativeCallHandlerInfo(local_540 + 3,byteArray_add,&local_168,&local_148);
  std::__cxx11::string::string
            ((string *)&local_128,"ByteArray",
             (allocator *)
             ((long)&handlers.
                     super__Vector_base<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::string((string *)&local_108,"_native_insert",&local_30);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_3a0,byteArray_insert,&local_128,&local_108);
  std::__cxx11::string::string((string *)&local_e8,"ByteArray",&local_2f);
  std::__cxx11::string::string((string *)&local_c8,"_native_at",&local_2e);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_338,byteArray_at,&local_e8,&local_c8);
  std::__cxx11::string::string((string *)&local_a8,"ByteArray",&local_2d);
  std::__cxx11::string::string((string *)&local_88,"remove",&local_2c);
  NativeCallHandlerInfo::NativeCallHandlerInfo(&local_2d0,byteArray_remove,&local_a8,&local_88);
  __l_00._M_len = 7;
  __l_00._M_array = local_540;
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            ((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage,__l_00,&local_2b);
  lVar2 = 0x270;
  do {
    NativeCallHandlerInfo::~NativeCallHandlerInfo
              ((NativeCallHandlerInfo *)((long)&local_540[0].handler + lVar2));
    lVar2 = lVar2 + -0x68;
  } while (lVar2 != -0x68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::vector
            (&in_RDI->scripts,(vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_68);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::vector
            (&in_RDI->handlers,
             (vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>
              *)&scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage);
  std::make_shared<chatra::emb::containers::ContainersPackageInterface>();
  _Var1._M_p = local_540[0].className._M_dataplus._M_p;
  (in_RDI->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_540[0].handler;
  local_540[0].className._M_dataplus._M_p = (pointer)0x0;
  (in_RDI->interface).super___shared_ptr<chatra::IPackage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1._M_p;
  local_540[0].handler = (NativeCallHandler)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_540[0].className);
  std::vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_>::
  ~vector((vector<chatra::NativeCallHandlerInfo,_std::allocator<chatra::NativeCallHandlerInfo>_> *)
          &scripts.super__Vector_base<chatra::Script,_std::allocator<chatra::Script>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage);
  std::vector<chatra::Script,_std::allocator<chatra::Script>_>::~vector
            ((vector<chatra::Script,_std::allocator<chatra::Script>_> *)local_68);
  return in_RDI;
}

Assistant:

PackageInfo packageInfo() {
	std::vector<Script> scripts = {{"containers", script}};
	std::vector<HandlerInfo> handlers = {
			{byteArray_initInstance, "ByteArray", "_init_instance"},
			{byteArray_size, "ByteArray", "size"},
			{byteArray_resize, "ByteArray", "_native_resize"},
			{byteArray_add, "ByteArray", "_native_add"},
			{byteArray_insert, "ByteArray", "_native_insert"},
			{byteArray_at, "ByteArray", "_native_at"},
			{byteArray_remove, "ByteArray", "remove"},
	};
	return {scripts, handlers, std::make_shared<ContainersPackageInterface>()};
}